

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  float fVar1;
  ulong uVar2;
  Point2f uv_00;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3f wRender;
  SampledSpectrum SVar7;
  optional<pbrt::Point2<float>_> uv;
  optional<pbrt::Bounds2<float>_> b;
  undefined1 local_40 [16];
  float local_30;
  float local_2c;
  float local_28;
  char local_24;
  
  uVar2._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
  auVar5._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
  auVar5._8_8_ = 0;
  auVar5 = vhaddps_avx(auVar5,auVar5);
  auVar5 = ZEXT416((uint)(auVar5._0_4_ + fVar1 * fVar1));
  auVar5 = vsqrtss_avx(auVar5,auVar5);
  fVar4 = auVar5._0_4_;
  auVar6._4_4_ = fVar4;
  auVar6._0_4_ = fVar4;
  auVar6._8_4_ = fVar4;
  auVar6._12_4_ = fVar4;
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 / fVar4;
  auVar5 = vdivps_avx(auVar3,auVar6);
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar5._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)local_40,wRender,(Float *)this);
  ImageBounds((optional<pbrt::Bounds2<float>_> *)(local_40 + 0xc),this,&ray->o);
  if ((((local_40[8] != '\x01') || (local_24 != '\x01')) ||
      ((float)local_40._0_4_ < (float)local_40._12_4_)) ||
     ((local_2c < (float)local_40._0_4_ || ((float)local_40._4_4_ < local_30)))) {
    SVar7.values.values = (array<float,_4>)ZEXT816(0);
  }
  else {
    SVar7.values.values = (array<float,_4>)ZEXT816(0);
    if ((float)local_40._4_4_ <= local_28) {
      uv_00.super_Tuple2<pbrt::Point2,_float>.y = (float)local_40._4_4_;
      uv_00.super_Tuple2<pbrt::Point2,_float>.x = (float)local_40._0_4_;
      SVar7 = ImageLookup(this,uv_00,lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar7;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    pstd::optional<Point2f> uv = ImageFromRender(Normalize(ray.d));
    pstd::optional<Bounds2f> b = ImageBounds(ray.o);
    if (!uv || !b || !Inside(*uv, *b))
        return SampledSpectrum(0.f);
    return ImageLookup(*uv, lambda);
}